

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtils.cpp
# Opt level: O0

SpatialInertia * iDynTree::getRandomInertia(void)

{
  SpatialInertia *in_RDI;
  double dVar1;
  double dVar2;
  Rotation *this;
  RotationalInertia *this_00;
  Position *this_01;
  Rotation rot;
  double rotInertiaData [9];
  double czz;
  double cyy;
  double cxx;
  SpatialInertia *inertiaLink;
  double *in_stack_fffffffffffffe68;
  double in_stack_fffffffffffffe78;
  double in_stack_fffffffffffffe80;
  SpatialInertia *this_02;
  double roll;
  
  this_02 = in_RDI;
  getRandomDouble(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  dVar1 = getRandomDouble(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  dVar2 = getRandomDouble(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  dVar2 = dVar2 + dVar1;
  dVar1 = 0.0;
  roll = 0.0;
  this = (Rotation *)getRandomDouble(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  this_00 = (RotationalInertia *)getRandomDouble(in_stack_fffffffffffffe80,(double)this);
  getRandomDouble(in_stack_fffffffffffffe80,(double)this);
  Rotation::RPY(roll,dVar1,dVar2);
  getRandomDouble(in_stack_fffffffffffffe80,(double)this);
  dVar1 = getRandomDouble(in_stack_fffffffffffffe80,(double)this);
  this_01 = (Position *)getRandomDouble(in_stack_fffffffffffffe80,(double)this);
  getRandomDouble((double)this_01,(double)this);
  Position::Position(this_01,(double)this,(double)this_00,(double)in_stack_fffffffffffffe68);
  RotationalInertia::RotationalInertia(this_00,in_stack_fffffffffffffe68,0,0x74c313);
  Rotation::operator*(this,this_00);
  SpatialInertia::SpatialInertia(this_02,dVar1,this_01,(RotationalInertia *)this);
  return in_RDI;
}

Assistant:

SpatialInertia getRandomInertia()
{
    double cxx = getRandomDouble(0,3);
    double cyy = getRandomDouble(0,4);
    double czz = getRandomDouble(0,6);
    double rotInertiaData[3*3] = {czz+cyy,0.0,0.0,
                                  0.0,cxx+czz,0.0,
                                  0.0,0.0,cxx+cyy};

    Rotation rot = Rotation::RPY(getRandomDouble(),getRandomDouble(-1,1),getRandomDouble());

    SpatialInertia inertiaLink(getRandomDouble(0,4),
                               Position(getRandomDouble(-2,2),getRandomDouble(-2,2),getRandomDouble(-2,2)),
                               rot*RotationalInertia(rotInertiaData,3,3));

    return inertiaLink;
}